

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void GetArms(Col_Word node,Col_Word *leftPtr,Col_Word *rightPtr)

{
  long lVar1;
  Col_Word CVar2;
  uint local_3c;
  uint local_38;
  uint local_34;
  ulong local_30;
  size_t leftLength;
  Col_Word source;
  Col_Word *rightPtr_local;
  Col_Word *leftPtr_local;
  Col_Word node_local;
  
  if (node == 0) {
    local_34 = 0;
  }
  else {
    if ((node & 0xf) == 0) {
      if ((*(byte *)node & 2) == 0) {
        local_3c = 0xffffffff;
      }
      else {
        local_3c = *(byte *)node & 0xfffffffe;
      }
      local_38 = local_3c;
    }
    else {
      local_38 = immediateWordTypes[node & 0x1f];
    }
    local_34 = local_38;
  }
  if (local_34 == 0x1e) {
    lVar1 = *(long *)(node + 8);
    local_30 = (ulong)*(ushort *)(lVar1 + 2);
    if (local_30 == 0) {
      local_30 = Col_ListLength(*(Col_Word *)(lVar1 + 0x10));
    }
    CVar2 = Col_Sublist(*(Col_Word *)(lVar1 + 0x10),*(size_t *)(node + 0x10),local_30 - 1);
    *leftPtr = CVar2;
    CVar2 = Col_Sublist(*(Col_Word *)(lVar1 + 0x18),0,*(long *)(node + 0x18) - local_30);
    *rightPtr = CVar2;
  }
  else {
    *leftPtr = *(Col_Word *)(node + 0x10);
    *rightPtr = *(Col_Word *)(node + 0x18);
  }
  return;
}

Assistant:

static void
GetArms(
    Col_Word rope,          /*!< Rope to extract arms from. Either a subrope or
                                 concat rope. */

    /*! [out] Left arm. */
    Col_Word * leftPtr,

    /*! [out] Right arm. */
    Col_Word * rightPtr)
{
    if (WORD_TYPE(rope) == WORD_TYPE_SUBROPE) {
        /*!
         * @sideeffect
         * If given a subrope of a concat node, create one subrope for each 
         * concat arm.
         */

        Col_Word source = WORD_SUBROPE_SOURCE(rope);
        size_t leftLength;

        ASSERT(WORD_SUBROPE_DEPTH(rope) >= 1);
        ASSERT(WORD_TYPE(source) == WORD_TYPE_CONCATROPE);
        ASSERT(WORD_CONCATROPE_DEPTH(source) == WORD_SUBROPE_DEPTH(rope));

        leftLength = WORD_CONCATROPE_LEFT_LENGTH(source);
        if (leftLength == 0) {
            leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(source));
        }
        *leftPtr = Col_Subrope(WORD_CONCATROPE_LEFT(source),
                WORD_SUBROPE_FIRST(rope), leftLength-1);
        *rightPtr = Col_Subrope(WORD_CONCATROPE_RIGHT(source), 0,
                WORD_SUBROPE_LAST(rope)-leftLength);
    } else {
        ASSERT(WORD_CONCATROPE_DEPTH(rope) >= 1);
        ASSERT(WORD_TYPE(rope) == WORD_TYPE_CONCATROPE);

        *leftPtr  = WORD_CONCATROPE_LEFT(rope);
        *rightPtr = WORD_CONCATROPE_RIGHT(rope);
    }
}